

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int luaB_loadfile(lua_State *L)

{
  int iVar1;
  char *filename;
  
  filename = luaL_optlstring(L,1,(char *)0x0,(size_t *)0x0);
  iVar1 = luaL_loadfile(L,filename);
  iVar1 = load_aux(L,iVar1);
  return iVar1;
}

Assistant:

static int luaB_loadfile(lua_State*L){
const char*fname=luaL_optstring(L,1,NULL);
return load_aux(L,luaL_loadfile(L,fname));
}